

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_block_statemach(connectdata *conn)

{
  smtp_conn *smtpc;
  CURLcode result;
  connectdata *conn_local;
  
  smtpc._4_4_ = CURLE_OK;
  while ((conn->proto).imapc.state != IMAP_STOP && smtpc._4_4_ == CURLE_OK) {
    smtpc._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_block_statemach(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  while(smtpc->state != SMTP_STOP && !result)
    result = Curl_pp_statemach(&smtpc->pp, TRUE);

  return result;
}